

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

int nn_trie_subscribe(nn_trie *self,uint8_t *data,size_t size)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  byte bVar5;
  int iVar6;
  nn_trie_node *pnVar7;
  void *pvVar8;
  ulong uVar9;
  undefined4 *puVar10;
  nn_trie_node *pnVar11;
  uint uVar12;
  ulong uVar13;
  byte *pbVar14;
  long lVar15;
  long lVar16;
  void *__src;
  uint uVar17;
  size_t sVar18;
  uint uVar19;
  
  pnVar11 = self->root;
  while( true ) {
    if (pnVar11 == (nn_trie_node *)0x0) goto LAB_001017bc;
    iVar6 = nn_node_check_prefix(pnVar11,data,size);
    sVar18 = (size_t)iVar6;
    pbVar14 = data + sVar18;
    lVar15 = size - sVar18;
    if (iVar6 < (int)(uint)pnVar11->prefix_len) break;
    if (size == sVar18) goto LAB_00101528;
    pnVar7 = (nn_trie_node *)nn_node_next(pnVar11,*pbVar14);
    if ((pnVar7 == (nn_trie_node *)0x0) ||
       (pnVar11 = *(nn_trie_node **)pnVar7, pnVar11 == (nn_trie_node *)0x0)) goto LAB_00101523;
    data = pbVar14 + 1;
    size = lVar15 - 1;
    self = (nn_trie *)pnVar7;
  }
  puVar10 = (undefined4 *)malloc(0x20);
  *self = (nn_trie)puVar10;
  if (puVar10 == (undefined4 *)0x0) {
    __assert_fail("*node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                  ,0x124,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
  }
  *puVar10 = 0;
  *(byte *)((long)puVar10 + 5) = (byte)iVar6;
  *(undefined1 *)(puVar10 + 1) = 1;
  memcpy((void *)((long)puVar10 + 6),pnVar11->prefix,sVar18);
  *(uint8_t *)(*(long *)self + 0x10) = pnVar11->prefix[sVar18];
  bVar5 = ~(byte)iVar6 + pnVar11->prefix_len;
  pnVar11->prefix_len = bVar5;
  memmove(pnVar11->prefix,pnVar11->prefix + sVar18 + 1,(ulong)bVar5);
  pnVar11 = nn_node_compact(pnVar11);
  *(nn_trie_node **)(*(long *)self + 0x18) = pnVar11;
LAB_00101523:
  if (size == sVar18) goto LAB_00101528;
  pvVar8 = self->root;
  bVar5 = *(byte *)((long)pvVar8 + 4);
  uVar13 = (ulong)bVar5;
  if (uVar13 < 8) {
    pvVar8 = realloc(pvVar8,uVar13 * 8 + 0x20);
    *self = (nn_trie)pvVar8;
    if (pvVar8 == (void *)0x0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                    ,0x13c,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
    }
    bVar5 = *(byte *)((long)pvVar8 + 4);
    *(byte *)((long)pvVar8 + (ulong)bVar5 + 0x10) = *pbVar14;
    bVar5 = bVar5 + 1;
    *(byte *)((long)pvVar8 + 4) = bVar5;
    *(undefined8 *)((long)pvVar8 + (ulong)bVar5 * 8 + 0x10) = 0;
    self = (nn_trie *)((long)pvVar8 + (ulong)bVar5 * 8 + 0x10);
    data = pbVar14 + 1;
    size = lVar15 - 1;
    goto LAB_001017c6;
  }
  if (bVar5 == 9) {
    bVar5 = *pbVar14;
    bVar2 = *(byte *)((long)pvVar8 + 0x10);
    bVar3 = *(byte *)((long)pvVar8 + 0x11);
    if ((bVar5 < bVar2) || (bVar3 < bVar5)) {
      uVar19 = (uint)bVar2;
      if (bVar5 <= bVar2) {
        uVar19 = (uint)bVar5;
      }
      uVar17 = (uint)bVar3;
      if (bVar3 <= bVar5) {
        uVar17 = (uint)bVar5;
      }
      pvVar8 = realloc(pvVar8,(long)(int)(uVar17 - uVar19) * 8 + 0x20);
      *self = (nn_trie)pvVar8;
      if (pvVar8 == (void *)0x0) {
        __assert_fail("*node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                      ,0x14f,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
      }
      bVar2 = *(byte *)((long)pvVar8 + 0x10);
      lVar16 = (ulong)*(byte *)((long)pvVar8 + 0x11) - (ulong)bVar2;
      lVar1 = lVar16 + 1;
      if (bVar2 == (byte)uVar19) {
        __src = (void *)((long)pvVar8 + (long)(int)lVar1 * 8 + 0x18);
        lVar16 = (long)(int)((uVar17 - uVar19) - (int)lVar16);
      }
      else {
        lVar16 = (long)(int)(bVar2 - uVar19);
        __src = (void *)((long)pvVar8 + 0x18);
        memmove((void *)((long)pvVar8 + lVar16 * 8 + 0x18),__src,lVar1 * 8);
      }
      memset(__src,0,lVar16 << 3);
      *(byte *)((long)pvVar8 + 0x10) = (byte)uVar19;
      *(char *)((long)pvVar8 + 0x11) = (char)uVar17;
    }
    *(short *)((long)pvVar8 + 0x12) = *(short *)((long)pvVar8 + 0x12) + 1;
    self = (nn_trie *)
           (*(long *)self + ((ulong)bVar5 - (ulong)*(byte *)(*(long *)self + 0x10)) * 8 + 0x18);
  }
  else {
    uVar19 = 0xff;
    uVar9 = 0;
    uVar17 = 0;
    while( true ) {
      if (uVar13 == uVar9) break;
      bVar2 = *(byte *)((long)pvVar8 + uVar9 + 0x10);
      if (bVar2 <= (byte)uVar19) {
        uVar19 = (uint)bVar2;
      }
      uVar12 = (uint)bVar2;
      if (bVar2 < (byte)uVar17) {
        uVar12 = uVar17;
      }
      uVar9 = uVar9 + 1;
      uVar17 = uVar12;
    }
    bVar2 = *pbVar14;
    if (bVar2 <= (byte)uVar19) {
      uVar19 = (uint)bVar2;
    }
    uVar12 = (uint)bVar2;
    if (bVar2 < (byte)uVar17) {
      uVar12 = uVar17;
    }
    puVar10 = (undefined4 *)malloc((long)(int)(uVar12 - uVar19) * 8 + 0x20);
    *self = (nn_trie)puVar10;
    if (puVar10 == (undefined4 *)0x0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                    ,0x17d,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
    }
    *puVar10 = 0;
    bVar2 = *(byte *)((long)pvVar8 + 5);
    *(byte *)((long)puVar10 + 5) = bVar2;
    *(undefined1 *)(puVar10 + 1) = 9;
    memcpy((void *)((long)puVar10 + 6),(void *)((long)pvVar8 + 6),(ulong)bVar2);
    *(char *)(puVar10 + 4) = (char)uVar19;
    *(char *)((long)puVar10 + 0x11) = (char)uVar12;
    *(ushort *)((long)puVar10 + 0x12) = bVar5 + 1;
    memset(puVar10 + 6,0,(long)(int)(uVar12 - uVar19) * 8 + 8);
    for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined8 *)
       (*(long *)self + 0x18 + ((ulong)*(byte *)((long)pvVar8 + uVar9 + 0x10) - (ulong)uVar19) * 8)
           = *(undefined8 *)((long)pvVar8 + uVar9 * 8 + 0x18);
    }
    self = (nn_trie *)nn_node_next(self->root,*pbVar14);
    free(pvVar8);
  }
  size = lVar15 - 1;
  data = pbVar14 + 1;
LAB_001017bc:
  if (self->root != (nn_trie_node *)0x0) {
    __assert_fail("!*node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                  ,0x197,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
  }
LAB_001017c6:
  while( true ) {
    pnVar11 = (nn_trie_node *)malloc((ulong)(10 < size) * 8 + 0x18);
    *self = (nn_trie)pnVar11;
    if (pnVar11 == (nn_trie_node *)0x0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                    ,0x19e,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
    }
    pnVar11->refcount = 0;
    pnVar11->type = 10 < size;
    sVar18 = 10;
    if (size < 10) {
      sVar18 = size;
    }
    pnVar11->prefix_len = (uint8_t)sVar18;
    memcpy(pnVar11->prefix,data,sVar18);
    if (size < 0xb) break;
    uVar13 = (ulong)self->root->prefix_len;
    pbVar14 = data + uVar13;
    data = pbVar14 + 1;
    (self->root->u).sparse.children[0] = *pbVar14;
    self = (nn_trie *)(self->root + 1);
    size = size + ~uVar13;
  }
LAB_00101528:
  uVar4 = self->root->refcount;
  self->root->refcount = uVar4 + 1;
  return (int)(uVar4 == 0);
}

Assistant:

int nn_trie_subscribe (struct nn_trie *self, const uint8_t *data, size_t size)
{
    int i;
    struct nn_trie_node **node;
    struct nn_trie_node **n;
    struct nn_trie_node *ch;
    struct nn_trie_node *old_node;
    int pos;
    uint8_t c;
    uint8_t c2;
    uint8_t new_min;
    uint8_t new_max;
    int old_children;
    int new_children;
    int inserted;
    int more_nodes;

    /*  Step 1 -- Traverse the trie. */

    node = &self->root;
    pos = 0;
    while (1) {

        /*  If there are no more nodes on the path, go to step 4. */
        if (!*node)
            goto step4;

        /*  Check whether prefix matches the new subscription. */
        pos = nn_node_check_prefix (*node, data, size);
        data += pos;
        size -= pos;

        /*  If only part of the prefix matches, go to step 2. */
        if (pos < (*node)->prefix_len)
            goto step2;

        /*  Even if whole prefix matches and there's no more data to match,
            go directly to step 5. */
        if (!size)
            goto step5;

        /*  Move to the next node. If it is not present, go to step 3. */
        n = nn_node_next (*node, *data);
        if (!n || !*n)
            goto step3;
        node = n;
        ++data;
        --size;
    }

    /*  Step 2 -- Split the prefix into two parts if required. */
step2:

    ch = *node;
    *node = nn_alloc (sizeof (struct nn_trie_node) +
        sizeof (struct nn_trie_node*), "trie node");
    assert (*node);
    (*node)->refcount = 0;
    (*node)->prefix_len = pos;
    (*node)->type = 1;
    memcpy ((*node)->prefix, ch->prefix, pos);
    (*node)->u.sparse.children [0] = ch->prefix [pos];
    ch->prefix_len -= (pos + 1);
    memmove (ch->prefix, ch->prefix + pos + 1, ch->prefix_len);
    ch = nn_node_compact (ch);
    *nn_node_child (*node, 0) = ch;
    pos = (*node)->prefix_len;

    /*  Step 3 -- Adjust the child array to accommodate the new character. */
step3:

    /*  If there are no more data in the subscription, there's nothing to
        adjust in the child array. Proceed directly to the step 5. */
    if (!size)
        goto step5;

    /*  If the new branch fits into sparse array... */
    if ((*node)->type < NN_TRIE_SPARSE_MAX) {
        *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
            ((*node)->type + 1) * sizeof (struct nn_trie_node*));
        assert (*node);
        (*node)->u.sparse.children [(*node)->type] = *data;
        ++(*node)->type;
        node = nn_node_child (*node, (*node)->type - 1);
        *node = NULL;
        ++data;
        --size;
        goto step4;
    }

    /*  If the node is already a dense array, resize it to fit the next
        character. */
    if ((*node)->type == NN_TRIE_DENSE_TYPE) {
        c = *data;
        if (c < (*node)->u.dense.min || c > (*node)->u.dense.max) {
            new_min = (*node)->u.dense.min < c ? (*node)->u.dense.min : c;
            new_max = (*node)->u.dense.max > c ? (*node)->u.dense.max : c;
            *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
                (new_max - new_min + 1) * sizeof (struct nn_trie_node*));
            assert (*node);
            old_children = (*node)->u.dense.max - (*node)->u.dense.min + 1;
            new_children = new_max - new_min + 1;
            if ((*node)->u.dense.min != new_min) {
                inserted = (*node)->u.dense.min - new_min;
                memmove (nn_node_child (*node, inserted),
                    nn_node_child (*node, 0),
                    old_children * sizeof (struct nn_trie_node*));
                memset (nn_node_child (*node, 0), 0,
                    inserted * sizeof (struct nn_trie_node*));
            }
            else {
                memset (nn_node_child (*node, old_children), 0,
                    (new_children - old_children) *
                    sizeof (struct nn_trie_node*));
            }
            (*node)->u.dense.min = new_min;
            (*node)->u.dense.max = new_max;
        }
        ++(*node)->u.dense.nbr;

        node = nn_node_child (*node, c - (*node)->u.dense.min);
        ++data;
        --size;
        goto step4;
    }

    /*  This is a sparse array, but no more children can be added to it.
        We have to convert it into a dense array. */
    {
        /*  First, determine the range of children. */
        new_min = 255;
        new_max = 0;
        for (i = 0; i != (*node)->type; ++i) {
            c2 = (*node)->u.sparse.children [i];
            new_min = new_min < c2 ? new_min : c2;
            new_max = new_max > c2 ? new_max : c2;
        }
        new_min = new_min < *data ? new_min : *data;
        new_max = new_max > *data ? new_max : *data;

        /*  Create a new mode, while keeping the old one for a while. */
        old_node = *node;
        *node = (struct nn_trie_node*) nn_alloc (sizeof (struct nn_trie_node) +
            (new_max - new_min + 1) * sizeof (struct nn_trie_node*),
            "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->prefix_len = old_node->prefix_len;
        (*node)->type = NN_TRIE_DENSE_TYPE;
        memcpy ((*node)->prefix, old_node->prefix, old_node->prefix_len);
        (*node)->u.dense.min = new_min;
        (*node)->u.dense.max = new_max;
        (*node)->u.dense.nbr = old_node->type + 1;
        memset (*node + 1, 0, (new_max - new_min + 1) *
            sizeof (struct nn_trie_node*));
        for (i = 0; i != old_node->type; ++i)
            *nn_node_child (*node, old_node->u.sparse.children [i] - new_min) =
                *nn_node_child (old_node, i);
        node = nn_node_next (*node, *data);
        ++data;
        --size;

        /*  Get rid of the obsolete old node. */
        nn_free (old_node);
    }

    /*  Step 4 -- Create new nodes for remaining part of the subscription. */
step4:

    assert (!*node);
    while (1) {

        /*  Create a new node to hold the next part of the subscription. */
        more_nodes = size > NN_TRIE_PREFIX_MAX;
        *node = nn_alloc (sizeof (struct nn_trie_node) +
            (more_nodes ? sizeof (struct nn_trie_node*) : 0), "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->type = more_nodes ? 1 : 0;
        (*node)->prefix_len = size < (uint8_t) NN_TRIE_PREFIX_MAX ?
            (uint8_t) size : (uint8_t) NN_TRIE_PREFIX_MAX;
        memcpy ((*node)->prefix, data, (*node)->prefix_len);
        data += (*node)->prefix_len;
        size -= (*node)->prefix_len;
        if (!more_nodes)
            break;
        (*node)->u.sparse.children [0] = *data;
        node = nn_node_child (*node, 0);
        ++data;
        --size;
    }

    /*  Step 5 -- Create the subscription as such. */
step5:

    ++(*node)->refcount;

    /*  Return 1 in case of a fresh subscription. */
    return (*node)->refcount == 1 ? 1 : 0;
}